

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O1

Cofaces_simplex_range * __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>::
cofaces_simplex_range
          (Cofaces_simplex_range *__return_storage_ptr__,
          Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured> *this,
          Simplex_handle *simplex,int codimension)

{
  Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>,_boost::container::map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>,_std::less<short>,_void,_void>_>
  *pSVar1;
  int iVar2;
  tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
  tVar3;
  Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>
  first;
  Fast_cofaces_predicate p;
  Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>
  last;
  Static_vertex_vector simp;
  Simplex_vertex_range rg;
  Optimized_star_simplex_range range;
  iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
  local_c28;
  Simplex_handle local_c20;
  iiterator_members<boost::intrusive::compact_rbtree_node<void_*>_*,_const_boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>_*,_false>
  local_c18;
  undefined1 local_c10 [128];
  undefined8 uStack_b90;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  void *local_8e0;
  undefined8 uStack_8d8;
  long local_8d0;
  Simplex_tree_optimized_star_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>
  local_8b8;
  iterator_range<Gudhi::Simplex_tree_optimized_star_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>_>
  local_5e0;
  
  if (codimension < 0) {
    __assert_fail("codimension >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/include/gudhi/Simplex_tree.h"
                  ,0x59f,
                  "Cofaces_simplex_range Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>::cofaces_simplex_range(const Simplex_handle, int) const [SimplexTreeOptions = Gudhi::Simplex_tree_options_custom_fil_values_full_featured]"
                 );
  }
  local_c20 = (Simplex_handle)(simplex->m_iit).members_.nodeptr_;
  simplex_vertex_range((Simplex_vertex_range *)(local_c10 + 0x58),this,&local_c20);
  local_c10._80_8_ = 0;
  first._8_4_ = local_c10._96_4_;
  first.sib_ = (Siblings *)local_c10._88_8_;
  first._12_4_ = 0;
  last._8_4_ = local_c10._112_4_;
  last.sib_ = (Siblings *)local_c10._104_8_;
  last._12_4_ = 0;
  boost::container::
  vector<short,boost::container::dtl::static_storage_allocator<short,40ul,0ul,true>,void>::
  assign<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>>>
            ((vector<short,boost::container::dtl::static_storage_allocator<short,40ul,0ul,true>,void>
              *)local_c10,first,last,(type *)0x0);
  tVar3.members_.nodeptr_ =
       (iiterator_members<boost::intrusive::compact_rbtree_node<void_*>_*,_const_boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>_*,_false>
        )((long)local_c10 + local_c10._80_8_ * 2);
  local_c28.m_iit.members_.nodeptr_ =
       (tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
        )(tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
          )tVar3.members_.nodeptr_;
  local_5e0.
  super_iterator_range_base<Gudhi::Simplex_tree_optimized_star_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>,_boost::iterators::incrementable_traversal_tag>
  .m_Begin.st_ = (Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured> *)
                 local_c10;
  std::
  __is_sorted_until<boost::container::vec_iterator<short*,false>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<short>>>
            (&local_c18);
  if ((iiterator_members<boost::intrusive::compact_rbtree_node<void_*>_*,_const_boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>_*,_false>
       )local_c18.nodeptr_ == tVar3.members_.nodeptr_) {
    Simplex_tree_optimized_star_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>
    ::Simplex_tree_optimized_star_simplex_iterator
              (&local_8b8,this,(Static_vertex_vector *)local_c10);
    local_b28 = 0;
    uStack_b20 = 0;
    local_b38 = 0;
    uStack_b30 = 0;
    local_ac8 = 0;
    uStack_ac0 = 0;
    local_ab8 = 0;
    uStack_ab0 = 0;
    local_9e8 = 0;
    uStack_9e0 = 0;
    local_9d8 = 0;
    uStack_9d0 = 0;
    local_978 = 0;
    uStack_970 = 0;
    local_968 = 0;
    uStack_960 = 0;
    local_8e0 = (void *)0x0;
    uStack_8d8 = 0;
    local_8d0 = 0;
    local_c10._120_8_ = 0;
    uStack_b90 = 0;
    local_a58 = 0;
    uStack_a50 = 0;
    local_a48 = 0;
    uStack_a40 = 0;
    local_908 = 0;
    uStack_900 = 0;
    local_8f8 = 0;
    uStack_8f0 = 0;
    boost::
    iterator_range<Gudhi::Simplex_tree_optimized_star_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>>>
    ::
    iterator_range<Gudhi::Simplex_tree_optimized_star_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>>>
              ((iterator_range<Gudhi::Simplex_tree_optimized_star_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>>>
                *)&local_5e0,&local_8b8,
               (Simplex_tree_optimized_star_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>
                *)(local_c10 + 0x78));
    if (local_8e0 != (void *)0x0) {
      operator_delete(local_8e0,local_8d0 - (long)local_8e0);
    }
    if (local_8b8.children_stack_.
        super__Vector_base<const_Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>,_boost::container::map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>,_std::less<short>,_void,_void>_>_*,_std::allocator<const_Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>,_boost::container::map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>,_std::less<short>,_void,_void>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_8b8.children_stack_.
                      super__Vector_base<const_Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>,_boost::container::map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>,_std::less<short>,_void,_void>_>_*,_std::allocator<const_Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>,_boost::container::map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>,_std::less<short>,_void,_void>_>_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_8b8.children_stack_.
                            super__Vector_base<const_Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>,_boost::container::map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>,_std::less<short>,_void,_void>_>_*,_std::allocator<const_Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>,_boost::container::map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>,_std::less<short>,_void,_void>_>_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_8b8.children_stack_.
                            super__Vector_base<const_Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>,_boost::container::map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>,_std::less<short>,_void,_void>_>_*,_std::allocator<const_Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>,_boost::container::map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>,_std::less<short>,_void,_void>_>_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    local_c28.m_iit.members_.nodeptr_ =
         (tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
          )(simplex->m_iit).members_.nodeptr_;
    pSVar1 = self_siblings<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<short_const,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>>>,void*,(boost::container::tree_type_enum)0,true>,boost::intrusive::rbtree_node_traits<void*,true>,(boost::intrusive::link_mode_type)0,boost::intrusive::dft_tag,3u>,false>,true>>
                       (this,&local_c28);
    iVar2 = -1;
    for (; pSVar1 != (Siblings *)0x0; pSVar1 = pSVar1->oncles_) {
      iVar2 = iVar2 + 1;
    }
    p.dim_ = iVar2 + codimension;
    p.codim_ = codimension;
    p.st_ = this;
    boost::range_detail::
    filtered_range<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>::Fast_cofaces_predicate,_boost::iterator_range<Gudhi::Simplex_tree_optimized_star_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>_>_>
    ::filtered_range(__return_storage_ptr__,p,&local_5e0);
    if (local_5e0.
        super_iterator_range_base<Gudhi::Simplex_tree_optimized_star_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>,_boost::iterators::incrementable_traversal_tag>
        .m_End.children_stack_.
        super__Vector_base<const_Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>,_boost::container::map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>,_std::less<short>,_void,_void>_>_*,_std::allocator<const_Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>,_boost::container::map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>,_std::less<short>,_void,_void>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_5e0.
                      super_iterator_range_base<Gudhi::Simplex_tree_optimized_star_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>,_boost::iterators::incrementable_traversal_tag>
                      .m_End.children_stack_.
                      super__Vector_base<const_Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>,_boost::container::map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>,_std::less<short>,_void,_void>_>_*,_std::allocator<const_Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>,_boost::container::map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>,_std::less<short>,_void,_void>_>_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_5e0.
                            super_iterator_range_base<Gudhi::Simplex_tree_optimized_star_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>,_boost::iterators::incrementable_traversal_tag>
                            .m_End.children_stack_.
                            super__Vector_base<const_Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>,_boost::container::map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>,_std::less<short>,_void,_void>_>_*,_std::allocator<const_Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>,_boost::container::map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>,_std::less<short>,_void,_void>_>_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_5e0.
                            super_iterator_range_base<Gudhi::Simplex_tree_optimized_star_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>,_boost::iterators::incrementable_traversal_tag>
                            .m_End.children_stack_.
                            super__Vector_base<const_Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>,_boost::container::map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>,_std::less<short>,_void,_void>_>_*,_std::allocator<const_Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>,_boost::container::map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>,_std::less<short>,_void,_void>_>_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_5e0.
        super_iterator_range_base<Gudhi::Simplex_tree_optimized_star_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>,_boost::iterators::incrementable_traversal_tag>
        .m_Begin.children_stack_.
        super__Vector_base<const_Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>,_boost::container::map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>,_std::less<short>,_void,_void>_>_*,_std::allocator<const_Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>,_boost::container::map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>,_std::less<short>,_void,_void>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_5e0.
                      super_iterator_range_base<Gudhi::Simplex_tree_optimized_star_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>,_boost::iterators::incrementable_traversal_tag>
                      .m_Begin.children_stack_.
                      super__Vector_base<const_Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>,_boost::container::map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>,_std::less<short>,_void,_void>_>_*,_std::allocator<const_Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>,_boost::container::map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>,_std::less<short>,_void,_void>_>_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_5e0.
                            super_iterator_range_base<Gudhi::Simplex_tree_optimized_star_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>,_boost::iterators::incrementable_traversal_tag>
                            .m_Begin.children_stack_.
                            super__Vector_base<const_Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>,_boost::container::map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>,_std::less<short>,_void,_void>_>_*,_std::allocator<const_Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>,_boost::container::map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>,_std::less<short>,_void,_void>_>_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_5e0.
                            super_iterator_range_base<Gudhi::Simplex_tree_optimized_star_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>,_boost::iterators::incrementable_traversal_tag>
                            .m_Begin.children_stack_.
                            super__Vector_base<const_Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>,_boost::container::map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>,_std::less<short>,_void,_void>_>_*,_std::allocator<const_Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>,_boost::container::map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>,_std::less<short>,_void,_void>_>_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("std::is_sorted(simp.begin(), simp.end(), std::greater<Vertex_handle>())",
                "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/include/gudhi/Simplex_tree.h"
                ,0x5a5,
                "Cofaces_simplex_range Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>::cofaces_simplex_range(const Simplex_handle, int) const [SimplexTreeOptions = Gudhi::Simplex_tree_options_custom_fil_values_full_featured]"
               );
}

Assistant:

Cofaces_simplex_range cofaces_simplex_range(const Simplex_handle simplex, int codimension) const{
    // codimension must be positive or null integer
    assert(codimension >= 0);

    if constexpr (Options::link_nodes_by_label) {
      Simplex_vertex_range rg = simplex_vertex_range(simplex);
      Static_vertex_vector simp(rg.begin(), rg.end());
      // must be sorted in decreasing order
      assert(std::is_sorted(simp.begin(), simp.end(), std::greater<Vertex_handle>()));
      auto range = Optimized_star_simplex_range(Optimized_star_simplex_iterator(this, std::move(simp)),
                                                Optimized_star_simplex_iterator());
      // Lazy filtered range
      Fast_cofaces_predicate select(this, codimension, this->dimension(simplex));
      return boost::adaptors::filter(range, select);
    } else {
      Cofaces_simplex_range cofaces;
      Simplex_vertex_range rg = simplex_vertex_range(simplex);
      std::vector<Vertex_handle> copy(rg.begin(), rg.end());
      if (codimension + static_cast<int>(copy.size()) > dimension_ + 1 ||
          (codimension == 0 && static_cast<int>(copy.size()) > dimension_))  // n+codimension greater than dimension_
        return cofaces;
      // must be sorted in decreasing order
      assert(std::is_sorted(copy.begin(), copy.end(), std::greater<Vertex_handle>()));
      bool star = codimension == 0;
      rec_coface(copy, &root_, 1, cofaces, star, codimension + static_cast<int>(copy.size()));
      return cofaces;
    }
  }